

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O3

void __thiscall
ctemplate::VariableTemplateNode::WriteHeaderEntries
          (VariableTemplateNode *this,string *outstring,string *filename)

{
  char *pcVar1;
  string local_40;
  
  pcVar1 = (this->token_).text;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,pcVar1,pcVar1 + (this->token_).textlen);
  anon_unknown_14::WriteOneHeaderEntry(outstring,&local_40,filename);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

virtual void WriteHeaderEntries(string *outstring,
                                  const string& filename) const {
    WriteOneHeaderEntry(outstring, string(token_.text, token_.textlen),
                        filename);
  }